

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

vec3 __thiscall djb::beckmann::u2_to_h2_std_radial(beckmann *this,vec2 *u,float_t zi,float_t z_i)

{
  float fVar1;
  float_t fVar2;
  float fVar3;
  float fVar4;
  vec3 vVar5;
  vec2 local_8;
  
  fVar4 = 0.0;
  if (0.0 <= u->x) {
    fVar4 = u->x;
  }
  fVar1 = 1.0;
  if (fVar4 <= 1.0) {
    fVar1 = fVar4;
  }
  fVar4 = 0.0;
  if (0.0 <= u->y) {
    fVar4 = u->y;
  }
  fVar3 = 1.0;
  if (fVar4 <= 1.0) {
    fVar3 = fVar4;
  }
  fVar4 = fVar3 * 0.99998 + 1e-05;
  fVar2 = qf2(this,fVar1 * 0.99998 + 1e-05,zi,z_i);
  local_8.y = erfinv(fVar4 + fVar4 + -1.0);
  local_8.x = fVar2;
  vVar5 = r2_to_h2(&local_8);
  return vVar5;
}

Assistant:

vec3 beckmann::u2_to_h2_std_radial(const vec2 &u, float_t zi, float_t z_i) const
{
	// remap u2 to avoid singularities
	float_t u1 = sat(u.x) * (float_t)0.99998 + (float_t)0.00001;
	float_t u2 = sat(u.y) * (float_t)0.99998 + (float_t)0.00001;
	return r2_to_h2(vec2(qf2(u1, zi, z_i), qf3(u2)));
}